

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BackwardSubsumptionDemodulation.cpp
# Opt level: O0

bool __thiscall
Inferences::BackwardSubsumptionDemodulation::rewriteCandidate
          (BackwardSubsumptionDemodulation *this,Clause *sideCl,Clause *mainCl,MLMatcherSD *matcher,
          Clause **replacement)

{
  undefined1 uVar1;
  int iVar2;
  uint uVar3;
  TermList *pTVar4;
  long in_RDI;
  uint i;
  RStack<Literal_*> resLits;
  Literal *newLit;
  Literal *lit2;
  uint li2;
  Literal *eqLitS;
  Result r_cmp_t;
  TermList t;
  bool dli_was_checked;
  TermList rhsS;
  TermList rhs;
  TermList lhs;
  iterator __end3;
  iterator __begin3;
  vector<Kernel::TermList,_std::allocator<Kernel::TermList>_> *__range3;
  TermList lhsSSort;
  TypedTermList lhsS;
  NonVariableNonTypeIterator nvi;
  Literal *dlit;
  uint dli;
  UnboundVariableOffsetApplicator applicator;
  TermList t1;
  TermList t0;
  bool preordered;
  Result eqArgOrder;
  TermList eqSort;
  Literal *eqLit;
  Ordering *ordering;
  unordered_map<unsigned_int,_Kernel::TermList,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_Kernel::TermList>_>_>
  *in_stack_fffffffffffffc78;
  OverlayBinder *in_stack_fffffffffffffc80;
  Literal *in_stack_fffffffffffffc98;
  Clause *in_stack_fffffffffffffca0;
  Ordering *in_stack_fffffffffffffca8;
  OverlayBinder *in_stack_fffffffffffffcb0;
  bool local_279;
  UnboundVariableOffsetApplicator local_80;
  uint64_t local_70;
  uint64_t local_68;
  undefined1 local_4d;
  Result local_4c;
  uint64_t local_48;
  Term *local_40;
  Ordering *local_38;
  bool local_1;
  
  local_38 = Saturation::SaturationAlgorithm::getOrdering((SaturationAlgorithm *)0x76fc08);
  local_40 = &Kernel::MLMatcherSD::getEqualityForDemodulation((MLMatcherSD *)0x76fc1d)->super_Term;
  if (local_40 == (Term *)0x0) {
    *(int *)(DAT_01333840 + 0x1b8) = *(int *)(DAT_01333840 + 0x1b8) + 1;
    local_1 = true;
  }
  else {
    local_48 = (uint64_t)Kernel::SortHelper::getEqualityArgumentSort(in_stack_fffffffffffffc98);
    local_4c = Kernel::Ordering::getEqualityArgumentOrder
                         (in_stack_fffffffffffffca8,(Literal *)in_stack_fffffffffffffca0);
    local_279 = local_4c == LESS || local_4c == GREATER;
    local_4d = local_279;
    if (((*(byte *)(in_RDI + 0x28) & 1) == 0) || (local_279)) {
      if ((rewriteCandidate(Kernel::Clause*,Kernel::Clause*,Kernel::MLMatcherSD_const&,Kernel::Clause*&)
           ::isMatched == '\0') &&
         (iVar2 = __cxa_guard_acquire(&rewriteCandidate(Kernel::Clause*,Kernel::Clause*,Kernel::MLMatcherSD_const&,Kernel::Clause*&)
                                       ::isMatched), iVar2 != 0)) {
        std::vector<bool,_std::allocator<bool>_>::vector
                  ((vector<bool,_std::allocator<bool>_> *)0x76fd09);
        __cxa_atexit(std::vector<bool,_std::allocator<bool>_>::~vector,&rewriteCandidate::isMatched,
                     &__dso_handle);
        __cxa_guard_release(&rewriteCandidate(Kernel::Clause*,Kernel::Clause*,Kernel::MLMatcherSD_const&,Kernel::Clause*&)
                             ::isMatched);
      }
      Kernel::MLMatcherSD::getMatchedAltsBitmap
                ((MLMatcherSD *)in_stack_fffffffffffffc80,
                 (vector<bool,_std::allocator<bool>_> *)in_stack_fffffffffffffc78);
      if ((rewriteCandidate(Kernel::Clause*,Kernel::Clause*,Kernel::MLMatcherSD_const&,Kernel::Clause*&)
           ::binder == '\0') &&
         (iVar2 = __cxa_guard_acquire(&rewriteCandidate(Kernel::Clause*,Kernel::Clause*,Kernel::MLMatcherSD_const&,Kernel::Clause*&)
                                       ::binder), iVar2 != 0)) {
        OverlayBinder::OverlayBinder(in_stack_fffffffffffffcb0);
        __cxa_atexit(OverlayBinder::~OverlayBinder,&rewriteCandidate::binder,&__dso_handle);
        __cxa_guard_release(&rewriteCandidate(Kernel::Clause*,Kernel::Clause*,Kernel::MLMatcherSD_const&,Kernel::Clause*&)
                             ::binder);
      }
      OverlayBinder::clear(in_stack_fffffffffffffc80);
      OverlayBinder::base(&rewriteCandidate::binder);
      Kernel::MLMatcherSD::getBindings
                ((MLMatcherSD *)in_stack_fffffffffffffc80,in_stack_fffffffffffffc78);
      if ((rewriteCandidate(Kernel::Clause*,Kernel::Clause*,Kernel::MLMatcherSD_const&,Kernel::Clause*&)
           ::lhsVector == '\0') &&
         (iVar2 = __cxa_guard_acquire(&rewriteCandidate(Kernel::Clause*,Kernel::Clause*,Kernel::MLMatcherSD_const&,Kernel::Clause*&)
                                       ::lhsVector), iVar2 != 0)) {
        std::vector<Kernel::TermList,_std::allocator<Kernel::TermList>_>::vector
                  ((vector<Kernel::TermList,_std::allocator<Kernel::TermList>_> *)0x76fdef);
        __cxa_atexit(std::vector<Kernel::TermList,_std::allocator<Kernel::TermList>_>::~vector,
                     &rewriteCandidate::lhsVector,&__dso_handle);
        __cxa_guard_release(&rewriteCandidate(Kernel::Clause*,Kernel::Clause*,Kernel::MLMatcherSD_const&,Kernel::Clause*&)
                             ::lhsVector);
      }
      std::vector<Kernel::TermList,_std::allocator<Kernel::TermList>_>::clear
                ((vector<Kernel::TermList,_std::allocator<Kernel::TermList>_> *)0x76fe21);
      pTVar4 = Kernel::Term::nthArgument(local_40,0);
      local_68 = pTVar4->_content;
      pTVar4 = Kernel::Term::nthArgument(local_40,1);
      local_70 = pTVar4->_content;
      uVar3 = Kernel::Clause::maxVar(in_stack_fffffffffffffca0);
      OverlayBinder::UnboundVariableOffsetApplicator::UnboundVariableOffsetApplicator
                (&local_80,&rewriteCandidate::binder,uVar3 + 1);
      uVar1 = (*(code *)(&DAT_00eefc7c + *(int *)(&DAT_00eefc7c + (ulong)(local_4c - GREATER) * 4)))
                        ();
      return (bool)uVar1;
    }
    local_1 = false;
  }
  return local_1;
}

Assistant:

bool BackwardSubsumptionDemodulation::rewriteCandidate(Clause* sideCl, Clause* mainCl, MLMatcherSD const& matcher, Clause*& replacement)
{
  Ordering const& ordering = _salg->getOrdering();
  // to see why we use this have a look at the respective line in ForwardSubsumptionDemodulation
  DEBUG_CODE(static bool isAlascaOrdering = env.options->termOrdering () == Shell::Options::TermOrdering::QKBO
                              || env.options->termOrdering () == Shell::Options::TermOrdering::LAKBO;)
  Literal* eqLit = matcher.getEqualityForDemodulation();
  if (!eqLit) {
    // eqLit == nullptr means that the whole side premise can be instantiated to some subset of the candidate,
    // i.e., we have subsumption.
#if VDEBUG && BSD_VDEBUG_REDUNDANCY_ASSERTIONS
    if (getOptions().literalComparisonMode() != Options::LiteralComparisonMode::REVERSE) {
      OverlayBinder tmpBinder;
      matcher.getBindings(tmpBinder.base());
      ASS(SDHelper::substClauseIsSmallerOrEqual(sideCl, tmpBinder, mainCl, ordering));
    }
#endif
    ASS(replacement == nullptr);
    env.statistics->backwardSubsumed++;
    return true;
  }
  ASS(eqLit->isEquality());
  ASS(eqLit->isPositive());

  TermList const eqSort = SortHelper::getEqualityArgumentSort(eqLit);

  Ordering::Result const eqArgOrder = ordering.getEqualityArgumentOrder(eqLit);
  bool const preordered = (eqArgOrder == Ordering::LESS) || (eqArgOrder == Ordering::GREATER);
  if (_preorderedOnly && !preordered) {
    return false;
  }

  // isMatched[i] is true iff (*mainCl)[i] is matched by some literal in sideCl (other than eqLit)
  static std::vector<bool> isMatched;
  matcher.getMatchedAltsBitmap(isMatched);

  static OverlayBinder binder;
  binder.clear();
  matcher.getBindings(binder.base());

  // NOTE: for explanation see comments in ForwardSubsumptionDemodulation::perform
  static std::vector<TermList> lhsVector;
  lhsVector.clear();
  {
    TermList t0 = *eqLit->nthArgument(0);
    TermList t1 = *eqLit->nthArgument(1);

    OverlayBinder::UnboundVariableOffsetApplicator applicator(binder, mainCl->maxVar()+1);
    switch (eqArgOrder) {
      case Ordering::INCOMPARABLE:
        ASS(!_preorderedOnly);  // would've skipped earlier already

        // If t0S does not contain all variables of t1S,
        // then t0Θ cannot be larger than t1Θ, where Θ is the final substitution (and S is the partial substitution after MLMatch).
        // (note this doesn't hold for occurrences: consider t0 = f(f(x,c)), t1 = f(x,x), θ = { x -> c }, then t0θ > t1θ)
        if (termContainsAllVariablesOfOtherUnderSubst(t0, t1, applicator)) {
          lhsVector.push_back(t0);
        }
        if (termContainsAllVariablesOfOtherUnderSubst(t1, t0, applicator)) {
          lhsVector.push_back(t1);
        }

        RSTAT_MCTR_INC("BSD, lhsVector.size() when INCOMPARABLE", lhsVector.size());
        break;
      case Ordering::GREATER:
        ASS(termContainsAllVariablesOfOtherUnderSubst(t0, t1, applicator));
        lhsVector.push_back(t0);
        break;
      case Ordering::LESS:
        ASS(termContainsAllVariablesOfOtherUnderSubst(t1, t0, applicator));
        lhsVector.push_back(t1);
        break;
      case Ordering::EQUAL:
        // This case may happen due to the partial substitution from the MLMatcher
        RSTAT_CTR_INC("BSD, terms equal after partial substitution");
        break;
      default:
        ASSERTION_VIOLATION;
    }
  }

  if (lhsVector.size() == 0) {
    RSTAT_CTR_INC("BSD, skipped match due to no LHS term candidates");
    return false;
  }



  static DHSet<TermList> attempted;  // Terms we already attempted to demodulate
  attempted.reset();

  for (unsigned dli = 0; dli < mainCl->length(); ++dli) {
    Literal* dlit = (*mainCl)[dli];  // literal to be demodulated

    // Only demodulate in literals that are not matched by the subsumption check
    if (isMatched[dli]) {
      continue;
    }

    // TODO higher-order support not yet implemented; see forward demodulation
    //      (maybe it's enough to just use the different iterator)
    ASS(!env.options->combinatorySup());
    NonVariableNonTypeIterator nvi(dlit);
    while (nvi.hasNext()) {
      TypedTermList lhsS = nvi.next();  // named 'lhsS' because it will be matched against 'lhs'

      if (!attempted.insert(lhsS)) {
        // We have already tried to demodulate the term lhsS and did not
        // succeed (otherwise we would have returned from the function).
        // If we have tried the term lhsS, we must have tried to
        // demodulate also its subterms, so we can skip them too.
        nvi.right();
        continue;
      }

      TermList const lhsSSort = lhsS.sort();

      ASS_LE(lhsVector.size(), 2);
      for (TermList lhs : lhsVector) {
        TermList rhs = EqHelper::getOtherEqualitySide(eqLit, lhs);

#if VDEBUG
        if (preordered) {
          if (eqArgOrder == Ordering::LESS) {
            ASS_EQ(rhs, *eqLit->nthArgument(0));
          } else {
            ASS_EQ(rhs, *eqLit->nthArgument(1));
          }
        }
#endif

        binder.reset();  // reset binder to state after subsumption check
        if (!MatchingUtils::matchTerms(lhs, lhsS, binder)) {
          continue;
        }
        // If lhs is a variable, we need to match its sort separately.
        if (lhs.isVar() && !MatchingUtils::matchTerms(eqSort, lhsSSort, binder)) {
          continue;
        }

#if VDEBUG
        {
          // There can be no unbound variables at this point;
          // otherwise we would have excluded the LHS already
          // in the ordering pre-check above
          auto mclVarIt = sideCl->getVariableIterator();  // includes vars in rhs
          while (mclVarIt.hasNext()) {
            unsigned int var = mclVarIt.next();
            ASS(binder.isBound(var));
          }
        }
#endif

        TermList rhsS = binder.applyTo(rhs);
        ASS_EQ(lhsS, binder.applyTo(lhs));

        if (!preordered && ordering.compare(lhsS, rhsS) != Ordering::GREATER) {
          continue;
        }

        // NOTE: see comments in ForwardSubsumptionDemodulation::perform for explanation
        if (!_allowIncompleteness) {
          bool dli_was_checked = false;
          if (!_enableOrderingOptimizations) {
            goto afterOptimizations;
          }
          {
          if (!dlit->isEquality()) {
            // non-equality literals are always larger than equality literals ==>  eqLitS < dlit
            ASS_EQ(ordering.compare(binder.applyTo(eqLit), dlit), Ordering::LESS);
            goto isRedundant;
          }
          if (lhsS != *dlit->nthArgument(0) && lhsS != *dlit->nthArgument(1)) {
            // lhsS appears as argument to some function, e.g. f(lhsS) = t
            // from subterm property of simplification ordering we know that lhsS < f(lhsS) and thus eqLitS < dlit
            ASS_EQ(ordering.compare(binder.applyTo(eqLit), dlit), Ordering::LESS);
            goto isRedundant;
          }
          // Now we are in the following situation:
          //
          //      eqLit              dlit
          //    vvvvvvvvv          vvvvvvvvv
          //    lhs = rhs \/ C     lhsS ?= t \/ CΘ \/ D
          //   ------------------------------------------
          //             rhsS ?= t \/ CΘ \/ D
          //
          //  where "?=" is either "=" or "≠".
          TermList t = EqHelper::getOtherEqualitySide(dlit, lhsS);
          if (t == rhsS) {
            ASS(eqLit->isPositive());
            if (dlit->isPositive()) {
              // in this case, eqLitS == dlit; and we have subsumption
              ASS_EQ(binder.applyTo(eqLit), dlit);  // eqLitS == dlit
#if VDEBUG && BSD_VDEBUG_REDUNDANCY_ASSERTIONS
              if (getOptions().literalComparisonMode() != Options::LiteralComparisonMode::REVERSE) {
                ASS(SDHelper::substClauseIsSmallerOrEqual(sideCl, binder, mainCl, ordering));
              }
#endif
              ASS(replacement == nullptr);
              env.statistics->backwardSubsumed++;
              return true;
            } else {
              // Here, we have subsumption resolution
              ASS_EQ(binder.applyTo(eqLit), Literal::complementaryLiteral(dlit));  // ¬eqLitS == dlit
              ASS_EQ(ordering.compare(binder.applyTo(eqLit), dlit), Ordering::GREATER);  // L > ¬L
              ASS(SDHelper::checkForSubsumptionResolution(mainCl, SDClauseMatches{sideCl,LiteralMiniIndex{mainCl}}, dlit));
              replacement = SDHelper::generateSubsumptionResolutionClause(mainCl, dlit, sideCl);
#if VDEBUG && BSD_VDEBUG_REDUNDANCY_ASSERTIONS
              if (getOptions().literalComparisonMode() != Options::LiteralComparisonMode::REVERSE) {
                // Note that mclθ < cl does not always hold here,
                // but we don't need it to ensure redundancy of cl
                // because cl is already entailed by replacement alone
                ASS(SDHelper::clauseIsSmaller(replacement, mainCl, ordering));
              }
#endif
              env.statistics->backwardSubsumptionResolution++;
              return true;
            }
          }
          dli_was_checked = true;
          Ordering::Result r_cmp_t = ordering.compare(rhsS, t);
          if (r_cmp_t == Ordering::LESS) {
            // rhsS < t implies eqLitS < dlit
            ASS_EQ(ordering.compare(binder.applyTo(eqLit), dlit), Ordering::LESS);
            goto isRedundant;
          }
          }
afterOptimizations:
          // We could not show redundancy with dlit alone,
          // so now we have to look at the other literals of the main premise
          Literal* eqLitS = Literal::createEquality(true, lhsS, rhsS, lhsSSort);
          ASS_EQ(eqLitS, binder.applyTo(eqLit));
          for (unsigned li2 = 0; li2 < mainCl->length(); li2++) {
            // skip dlit (already checked with r_cmp_t above) and matched literals (i.e., CΘ)
            if ((!dli_was_checked || dli != li2) && !isMatched[li2]) {
              Literal* lit2 = (*mainCl)[li2];
              if (ordering.compare(eqLitS, lit2) == Ordering::LESS) {
                // we found that eqLitS < lit2; and thus sideCl < mainCl => after inference, mainCl is redundant
                goto isRedundant;
              }
            }
          }
          // mainCl is not be redundant after the inference, possibly leading to incompleteness => skip
          RSTAT_CTR_INC("BSD, main premise not redundant");
          continue;
        }  // if (!_allowIncompleteness)
isRedundant:

#if VDEBUG && BSD_VDEBUG_REDUNDANCY_ASSERTIONS
        if (getOptions().literalComparisonMode() != Options::LiteralComparisonMode::REVERSE && !isAlascaOrdering) {
          // Check mclΘ < cl.
          // This is not clear and might easily be violated if we have a bug above.
          if (!SDHelper::substClauseIsSmaller(sideCl, binder, mainCl, ordering)) {
            std::cerr << "BSD: redundancy violated!" << std::endl;
            std::cerr << "side: " << sideCl->toString() << std::endl;
            std::cerr << "main: " << mainCl->toString() << std::endl;
            std::cerr << "sideS < main required but it doesn't seem to be the case" << std::endl;
            ASSERTION_VIOLATION;
          }
        }
#endif

        /**
         * Step 4: found application of SD; now create the conclusion
         */
        Literal* newLit = EqHelper::replace(dlit, lhsS, rhsS);
#if VDEBUG
        if (!isAlascaOrdering)
          ASS_EQ(ordering.compare(lhsS, rhsS), Ordering::GREATER);
        if (getOptions().literalComparisonMode() != Options::LiteralComparisonMode::REVERSE
            && !isAlascaOrdering) {
          // blows up with "-lcm reverse"; but the same thing happens with normal demodulation, so this might be intended?
          ASS_EQ(ordering.compare(dlit, newLit), Ordering::GREATER);
        }
#endif

        if (EqHelper::isEqTautology(newLit)) {
          env.statistics->backwardSubsumptionDemodulationsToEqTaut++;
          ASS(replacement == nullptr);
          return true;
        }

        RStack<Literal*> resLits;

        for (unsigned i = 0; i < mainCl->length(); ++i) {
          if (i == dli) {
            resLits->push(newLit);
          } else {
            resLits->push((*mainCl)[i]);
          }
        }

        env.statistics->backwardSubsumptionDemodulations++;

        replacement = Clause::fromStack(*resLits,
            SimplifyingInference2(InferenceRule::BACKWARD_SUBSUMPTION_DEMODULATION, mainCl, sideCl));

#if BSD_LOG_INFERENCES
        std::cout << "\% Begin Inference \"BSD-" << replacement->number() << "\"\n";
        std::cout << "\% eqLit: " << eqLit->toString() << "\n";
        std::cout << "\% eqLitS: " << binder.applyTo(eqLit)->toString() << "\n";
        std::cout << "\% dlit: " << dlit->toString() << "\n";
        // std::cout << "\% numMatches+1: success at match #" << (numMatches+1) << "\n";
        TPTPPrinter tptp;
        // NOTE: do not output the splitLevels here, because those will be set for replacement only later
        tptp.printWithRole("side_premise", "hypothesis", sideCl, false);
        tptp.printWithRole("main_premise", "hypothesis", mainCl, false);
        tptp.printWithRole("conclusion  ", "conjecture", replacement, false);
        // TODO: Some problems (seems to be only the CSR category; it happens, e.g., in CSR104+4)
        //       use integer constants as sort $i but vampire parses them as $int when using tff.
        //       For these formulas we should use fof, then it works again.
        //       Problem: how to detect that situation??
        //       probably if the input only contains FOF and no TFF
        // TODO: Also don't output type defs for $$false and $$true, see problem SYO091^5.p
        std::cout << "\% End Inference \"BSD-" << replacement->number() << "\"" << std::endl;
#endif

#if VDEBUG && BSD_VDEBUG_REDUNDANCY_ASSERTIONS
        if (getOptions().literalComparisonMode() != Options::LiteralComparisonMode::REVERSE
            && !isAlascaOrdering) {  // see note above
          // Check replacement < mainCl.
          ASS(SDHelper::clauseIsSmaller(replacement, mainCl, ordering));
        }
#endif

        return true;
      }  // for (lhs)
    }  // while (nvi.hasNext())
  }  // for (dli)

  return false;
}